

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_test_helper.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceMapEvent::PriceMapEvent
          (PriceMapEvent *this,uint32_t sid,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_PriceEvent)._vptr_PriceEvent = (_func_int **)&PTR___cxa_pure_virtual_0029dd40;
  p_Var1 = &(this->price_)._M_t._M_impl.super__Rb_tree_header;
  (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->price_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->sid_ = sid;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator=(&(this->price_)._M_t,&price->_M_t);
  return;
}

Assistant:

PriceMapEvent::PriceMapEvent(uint32_t sid, std::map<std::string, PriceField> price)
{
    sid_ = sid;
    price_ = price;
}